

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

void __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::RealSchur
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index size)

{
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,size,size);
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::resize
            (&(this->m_matU).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,size,size)
  ;
  Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->m_workspaceVector,size);
  HessenbergDecomposition<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::HessenbergDecomposition
            (&this->m_hess,size);
  this->m_isInitialized = false;
  this->m_matUisUptodate = false;
  this->m_maxIters = -1;
  return;
}

Assistant:

RealSchur(Index size = RowsAtCompileTime==Dynamic ? 1 : RowsAtCompileTime)
            : m_matT(size, size),
              m_matU(size, size),
              m_workspaceVector(size),
              m_hess(size),
              m_isInitialized(false),
              m_matUisUptodate(false),
              m_maxIters(-1)
    { }